

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

void Cec_ManSimMemRelink(Cec_ManSim_t *p)

{
  uint *puVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  
  uVar2 = (p->nWords + 1) * p->nMems;
  piVar3 = &p->MemFree;
  if (p->nWords + uVar2 + 1 < (uint)p->nWordsAlloc) {
    puVar1 = p->pMems;
    do {
      *piVar3 = uVar2;
      piVar3 = (int *)(puVar1 + uVar2);
      iVar4 = uVar2 + p->nWords * 2;
      uVar2 = uVar2 + p->nWords + 1;
    } while (iVar4 + 2U < (uint)p->nWordsAlloc);
  }
  *piVar3 = 0;
  p->nWordsOld = p->nWords;
  return;
}

Assistant:

void Cec_ManSimMemRelink( Cec_ManSim_t * p )
{
    unsigned * pPlace, Ent;
    pPlace = (unsigned *)&p->MemFree;
    for ( Ent = p->nMems * (p->nWords + 1); 
          Ent + p->nWords + 1 < (unsigned)p->nWordsAlloc; 
          Ent += p->nWords + 1 )
    {
        *pPlace = Ent;
        pPlace = p->pMems + Ent;
    }
    *pPlace = 0;
    p->nWordsOld = p->nWords;
}